

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O3

InLineIfTag * __thiscall Qentem::Tags::TagBit::MakeInLineIfTag(TagBit *this)

{
  int *piVar1;
  InLineIfTag *pIVar2;
  long lVar3;
  ulong uVar4;
  
  pIVar2 = (InLineIfTag *)operator_new(0x30);
  if (MemoryRecord::AddAllocation(void*)::storage == '\0') {
    MakeInLineIfTag();
  }
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  *MemoryRecord::AddAllocation(void*)::storage = *MemoryRecord::AddAllocation(void*)::storage + 1;
  piVar1[2] = piVar1[2] + 1;
  lVar3 = malloc_usable_size(pIVar2);
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  uVar4 = lVar3 + *(long *)(MemoryRecord::AddAllocation(void*)::storage + 4);
  *(ulong *)(MemoryRecord::AddAllocation(void*)::storage + 4) = uVar4;
  if (*(ulong *)(piVar1 + 6) < uVar4) {
    *(ulong *)(piVar1 + 6) = uVar4;
  }
  (pIVar2->SubTags).storage_ = (TagBit *)0x0;
  (pIVar2->SubTags).index_ = 0;
  (pIVar2->SubTags).capacity_ = 0;
  pIVar2->Offset = 0;
  pIVar2->Length = 0;
  pIVar2->TrueOffset = 0;
  pIVar2->TrueLength = 0;
  pIVar2->FalseOffset = 0;
  pIVar2->FalseLength = 0;
  pIVar2->TrueTagsStartID = '\0';
  pIVar2->FalseTagsStartID = '\0';
  (pIVar2->Case).storage_ = (QExpression *)0x0;
  (pIVar2->Case).index_ = 0;
  (pIVar2->Case).capacity_ = 0;
  (pIVar2->SubTags).storage_ = (TagBit *)0x0;
  (pIVar2->SubTags).index_ = 0;
  (pIVar2->SubTags).capacity_ = 0;
  this->type_ = InLineIf;
  this->storage_ = pIVar2;
  return pIVar2;
}

Assistant:

InLineIfTag *MakeInLineIfTag() {
        InLineIfTag *tag = Memory::AllocateInit<InLineIfTag>();

        type_    = TagType::InLineIf;
        storage_ = tag;

        return tag;
    }